

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBools::InternalSwap
          (TensorValue_RepeatedBools *this,TensorValue_RepeatedBools *other)

{
  intptr_t iVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar5 = (this->values_).current_size_;
  iVar6 = (this->values_).total_size_;
  pvVar2 = (this->values_).arena_or_elements_;
  iVar4 = (other->values_).total_size_;
  pvVar3 = (other->values_).arena_or_elements_;
  (this->values_).current_size_ = (other->values_).current_size_;
  (this->values_).total_size_ = iVar4;
  (this->values_).arena_or_elements_ = pvVar3;
  (other->values_).current_size_ = iVar5;
  (other->values_).total_size_ = iVar6;
  (other->values_).arena_or_elements_ = pvVar2;
  return;
}

Assistant:

void TensorValue_RepeatedBools::InternalSwap(TensorValue_RepeatedBools* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  values_.InternalSwap(&other->values_);
}